

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSampleRenderCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ostream *poVar1;
  RenderContext *pRVar2;
  ContextType local_1d4;
  string local_1d0;
  int local_1b0;
  int local_1ac;
  int ndx_2;
  int ndx_1;
  int ndx;
  undefined1 local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  InterpolateAtSampleRenderCase *this_local;
  
  buf._372_4_ = numTargetSamples;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  if (*(int *)((long)this + 0xbc) == 0) {
    std::operator<<((ostream *)local_198,"in highp float v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 1) {
    std::operator<<((ostream *)local_198,"in highp vec2 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 2) {
    std::operator<<((ostream *)local_198,"in highp vec3 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 3) {
    std::operator<<((ostream *)local_198,"in highp vec4 v_input;\n");
  }
  else if (*(int *)((long)this + 0xbc) == 4) {
    std::operator<<((ostream *)local_198,"in highp vec2[2] v_input;\n");
  }
  std::operator<<((ostream *)local_198,"layout(location = 0) out mediump vec4 fragColor;\n");
  if (*(int *)((long)this + 0x128) == 1) {
    std::operator<<((ostream *)local_198,"uniform highp int u_offset;\nuniform highp int u_range;\n"
                   );
  }
  std::operator<<((ostream *)local_198,"void main (void)\n{\n\tmediump int coverage = 0;\n\n");
  if (*(int *)((long)this + 0x128) == 0) {
    for (ndx_2 = 0; ndx_2 < (int)buf._372_4_; ndx_2 = ndx_2 + 1) {
      if (*(int *)((long)this + 0xbc) == 0) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp float sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        poVar1 = std::operator<<(poVar1," = interpolateAtSample(v_input, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        std::operator<<(poVar1,");\n");
      }
      else if (*(int *)((long)this + 0xbc) == 1) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp vec2 sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        poVar1 = std::operator<<(poVar1," = interpolateAtSample(v_input, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        std::operator<<(poVar1,");\n");
      }
      else if (*(int *)((long)this + 0xbc) == 2) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp vec3 sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        poVar1 = std::operator<<(poVar1," = interpolateAtSample(v_input, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        std::operator<<(poVar1,");\n");
      }
      else if (*(int *)((long)this + 0xbc) == 3) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp vec4 sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        poVar1 = std::operator<<(poVar1," = interpolateAtSample(v_input, ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        std::operator<<(poVar1,");\n");
      }
      else if (*(int *)((long)this + 0xbc) == 4) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp vec2 sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        poVar1 = std::operator<<(poVar1," = interpolateAtSample(v_input[1], ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,ndx_2);
        std::operator<<(poVar1,");\n");
      }
    }
    std::operator<<((ostream *)local_198,"\n");
    for (local_1ac = 0; local_1ac < (int)buf._372_4_; local_1ac = local_1ac + 1) {
      if (*(int *)((long)this + 0xbc) == 0) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp float field");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1," = exp(sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,") + sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,"*sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        std::operator<<(poVar1,";\n");
      }
      else if ((*(int *)((long)this + 0xbc) == 1) || (*(int *)((long)this + 0xbc) == 4)) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp float field");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1," = dot(sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,", sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,") + dot(21.0 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".xx, sin(3.1 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        std::operator<<(poVar1,"));\n");
      }
      else if (*(int *)((long)this + 0xbc) == 2) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp float field");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1," = dot(sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".xy, sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".xy) + dot(21.0 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".zx, sin(3.1 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        std::operator<<(poVar1,".zy));\n");
      }
      else if (*(int *)((long)this + 0xbc) == 3) {
        poVar1 = std::operator<<((ostream *)local_198,"\thighp float field");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1," = dot(sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".xy, sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".zw) + dot(21.0 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        poVar1 = std::operator<<(poVar1,".zy, sin(3.1 * sampleInput");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
        std::operator<<(poVar1,".zw));\n");
      }
    }
    std::operator<<((ostream *)local_198,"\n");
    for (local_1b0 = 0; local_1b0 < (int)buf._372_4_; local_1b0 = local_1b0 + 1) {
      poVar1 = std::operator<<((ostream *)local_198,"\tif (fract(field");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
      std::operator<<(poVar1,") <= 0.5)\n\t\t++coverage;\n");
    }
  }
  else if (*(int *)((long)this + 0x128) == 1) {
    poVar1 = std::operator<<((ostream *)local_198,"\tfor (int ndx = 0; ndx < ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,buf._372_4_);
    std::operator<<(poVar1,"; ++ndx)\n\t{\n");
    if (*(int *)((long)this + 0xbc) == 0) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp float sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 1) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp vec2 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 2) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp vec3 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 3) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp vec4 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 4) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp vec2 sampleInput = interpolateAtSample(v_input[1], (u_offset + ndx) % u_range);\n"
                     );
    }
    if (*(int *)((long)this + 0xbc) == 0) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp float field = exp(sampleInput) + sampleInput*sampleInput;\n");
    }
    else if ((*(int *)((long)this + 0xbc) == 1) || (*(int *)((long)this + 0xbc) == 4)) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp float field = dot(sampleInput, sampleInput) + dot(21.0 * sampleInput.xx, sin(3.1 * sampleInput));\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 2) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp float field = dot(sampleInput.xy, sampleInput.xy) + dot(21.0 * sampleInput.zx, sin(3.1 * sampleInput.zy));\n"
                     );
    }
    else if (*(int *)((long)this + 0xbc) == 3) {
      std::operator<<((ostream *)local_198,
                      "\t\thighp float field = dot(sampleInput.xy, sampleInput.zw) + dot(21.0 * sampleInput.zy, sin(3.1 * sampleInput.zw));\n"
                     );
    }
    std::operator<<((ostream *)local_198,"\t\tif (fract(field) <= 0.5)\n\t\t\t++coverage;\n\t}\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\tfragColor = vec4(vec3(float(coverage) / float(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,buf._372_4_);
  std::operator<<(poVar1,")), 1.0);\n}");
  std::__cxx11::ostringstream::str();
  pRVar2 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1d4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1d0,&local_1d4);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSampleRenderCase::genFragmentSource (int numTargetSamples) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_iteration == 0)
		buf << "in highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "in highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "in highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "in highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "in highp vec2[2] v_input;\n";
	else
		DE_ASSERT(false);

	buf << "layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_indexMode == INDEXING_DYNAMIC)
		buf <<	"uniform highp int u_offset;\n"
				"uniform highp int u_range;\n";

	buf <<	"void main (void)\n"
			"{\n"
			"	mediump int coverage = 0;\n"
			"\n";

	if (m_indexMode == INDEXING_STATIC)
	{
		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf <<	"	highp float sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 1)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 2)
				buf <<	"	highp vec3 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 3)
				buf <<	"	highp vec4 sampleInput" << ndx << " = interpolateAtSample(v_input, " << ndx << ");\n";
			else if (m_iteration == 4)
				buf <<	"	highp vec2 sampleInput" << ndx << " = interpolateAtSample(v_input[1], " << ndx << ");\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
		{
			if (m_iteration == 0)
				buf << "	highp float field" << ndx << " = exp(sampleInput" << ndx << ") + sampleInput" << ndx << "*sampleInput" << ndx << ";\n";
			else if (m_iteration == 1 || m_iteration == 4)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ", sampleInput" << ndx << ") + dot(21.0 * sampleInput" << ndx << ".xx, sin(3.1 * sampleInput" << ndx << "));\n";
			else if (m_iteration == 2)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".xy) + dot(21.0 * sampleInput" << ndx << ".zx, sin(3.1 * sampleInput" << ndx << ".zy));\n";
			else if (m_iteration == 3)
				buf << "	highp float field" << ndx << " = dot(sampleInput" << ndx << ".xy, sampleInput" << ndx << ".zw) + dot(21.0 * sampleInput" << ndx << ".zy, sin(3.1 * sampleInput" << ndx << ".zw));\n";
			else
				DE_ASSERT(false);
		}
		buf <<	"\n";

		for (int ndx = 0; ndx < numTargetSamples; ++ndx)
			buf <<	"	if (fract(field" << ndx << ") <= 0.5)\n"
					"		++coverage;\n";
	}
	else if (m_indexMode == INDEXING_DYNAMIC)
	{
		buf <<	"	for (int ndx = 0; ndx < " << numTargetSamples << "; ++ndx)\n"
				"	{\n";

		if (m_iteration == 0)
			buf <<	"		highp float sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 1)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 2)
			buf <<	"		highp vec3 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 3)
			buf <<	"		highp vec4 sampleInput = interpolateAtSample(v_input, (u_offset + ndx) % u_range);\n";
		else if (m_iteration == 4)
			buf <<	"		highp vec2 sampleInput = interpolateAtSample(v_input[1], (u_offset + ndx) % u_range);\n";
		else
			DE_ASSERT(false);

		if (m_iteration == 0)
			buf << "		highp float field = exp(sampleInput) + sampleInput*sampleInput;\n";
		else if (m_iteration == 1 || m_iteration == 4)
			buf << "		highp float field = dot(sampleInput, sampleInput) + dot(21.0 * sampleInput.xx, sin(3.1 * sampleInput));\n";
		else if (m_iteration == 2)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.xy) + dot(21.0 * sampleInput.zx, sin(3.1 * sampleInput.zy));\n";
		else if (m_iteration == 3)
			buf << "		highp float field = dot(sampleInput.xy, sampleInput.zw) + dot(21.0 * sampleInput.zy, sin(3.1 * sampleInput.zw));\n";
		else
			DE_ASSERT(false);

		buf <<	"		if (fract(field) <= 0.5)\n"
				"			++coverage;\n"
				"	}\n";
	}

	buf <<	"	fragColor = vec4(vec3(float(coverage) / float(" << numTargetSamples << ")), 1.0);\n"
			"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}